

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_head_file_extra(archive_read *a,archive_entry *e,rar5 *rar,int64_t extra_data_size)

{
  wchar_t wVar1;
  uint64_t local_50;
  uint64_t var_size;
  uint64_t uStack_40;
  wchar_t ret;
  uint64_t extra_field_id;
  uint64_t extra_field_size;
  int64_t extra_data_size_local;
  rar5 *rar_local;
  archive_entry *e_local;
  archive_read *a_local;
  
  uStack_40 = 0;
  var_size._4_4_ = L'\xffffffe2';
  extra_field_size = extra_data_size;
  extra_data_size_local = (int64_t)rar;
  rar_local = (rar5 *)e;
  e_local = (archive_entry *)a;
  while( true ) {
    if ((long)extra_field_size < 1) {
      if (var_size._4_4_ != L'\0') {
        return var_size._4_4_;
      }
      return L'\0';
    }
    wVar1 = read_var((archive_read *)e_local,&extra_field_id,&local_50);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    extra_field_size = extra_field_size - local_50;
    wVar1 = consume((archive_read *)e_local,local_50);
    if (wVar1 != L'\0') {
      return L'\x01';
    }
    wVar1 = read_var((archive_read *)e_local,&stack0xffffffffffffffc0,&local_50);
    if (wVar1 == L'\0') break;
    extra_field_id = extra_field_id - local_50;
    extra_field_size = extra_field_size - local_50;
    wVar1 = consume((archive_read *)e_local,local_50);
    if (wVar1 != L'\0') {
      return L'\x01';
    }
    switch(uStack_40) {
    case 1:
      archive_entry_set_is_data_encrypted((archive_entry *)rar_local,'\x01');
      *(undefined4 *)(extra_data_size_local + 0x5334) = 1;
      *(byte *)(extra_data_size_local + 0x38) =
           *(byte *)(extra_data_size_local + 0x38) & 0xef | 0x10;
    case 7:
    default:
      extra_field_size = extra_field_size - extra_field_id;
      wVar1 = consume((archive_read *)e_local,extra_field_id);
      if (wVar1 != L'\0') {
        return L'\x01';
      }
      break;
    case 2:
      var_size._4_4_ =
           parse_file_extra_hash
                     ((archive_read *)e_local,(rar5 *)extra_data_size_local,
                      (int64_t *)&extra_field_size);
      break;
    case 3:
      var_size._4_4_ =
           parse_file_extra_htime
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (rar5 *)extra_data_size_local,(int64_t *)&extra_field_size);
      break;
    case 4:
      var_size._4_4_ =
           parse_file_extra_version
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (int64_t *)&extra_field_size);
      break;
    case 5:
      var_size._4_4_ =
           parse_file_extra_redir
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (rar5 *)extra_data_size_local,(int64_t *)&extra_field_size);
      break;
    case 6:
      var_size._4_4_ =
           parse_file_extra_owner
                     ((archive_read *)e_local,(archive_entry *)rar_local,
                      (int64_t *)&extra_field_size);
    }
  }
  return L'\x01';
}

Assistant:

static int process_head_file_extra(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, int64_t extra_data_size)
{
	uint64_t extra_field_size;
	uint64_t extra_field_id = 0;
	int ret = ARCHIVE_FATAL;
	uint64_t var_size;

	while(extra_data_size > 0) {
		if(!read_var(a, &extra_field_size, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		if(!read_var(a, &extra_field_id, &var_size))
			return ARCHIVE_EOF;

		extra_field_size -= var_size;
		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		switch(extra_field_id) {
			case EX_HASH:
				ret = parse_file_extra_hash(a, rar,
				    &extra_data_size);
				break;
			case EX_HTIME:
				ret = parse_file_extra_htime(a, e, rar,
				    &extra_data_size);
				break;
			case EX_REDIR:
				ret = parse_file_extra_redir(a, e, rar,
				    &extra_data_size);
				break;
			case EX_UOWNER:
				ret = parse_file_extra_owner(a, e,
				    &extra_data_size);
				break;
			case EX_VERSION:
				ret = parse_file_extra_version(a, e,
				    &extra_data_size);
				break;
			case EX_CRYPT:
				/* Mark the entry as encrypted */
				archive_entry_set_is_data_encrypted(e, 1);
				rar->has_encrypted_entries = 1;
				rar->cstate.data_encrypted = 1;
				/* fallthrough */
			case EX_SUBDATA:
				/* fallthrough */
			default:
				/* Skip unsupported entry. */
				extra_data_size -= extra_field_size;
				if (ARCHIVE_OK != consume(a, extra_field_size)) {
					return ARCHIVE_EOF;
				}
		}
	}

	if(ret != ARCHIVE_OK) {
		/* Attribute not implemented. */
		return ret;
	}

	return ARCHIVE_OK;
}